

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

bool anon_unknown.dwarf_a9a5e::testRequired(void)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  int i;
  string str;
  Value v;
  int local_8c;
  long *local_88;
  char *local_80;
  long local_78 [2];
  ValueHolder local_68 [5];
  Value local_40;
  
  Json::Value::Value(&local_40,"Hello");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"default","");
  local_8c = 1;
  local_68[0].string_ = (char *)&local_40;
  if ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_._16_8_ == 0) goto LAB_00179d51;
  iVar1 = (*(code *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_,&local_88,local_68);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar1 == 0) {
      local_68[0].string_ = (char *)&local_40;
      if ((anonymous_namespace)::RequiredIntHelper._16_8_ == 0) {
LAB_00179d51:
        std::__throw_bad_function_call();
      }
      iVar1 = (*(code *)(anonymous_namespace)::RequiredIntHelper._24_8_)
                        ((anonymous_namespace)::RequiredIntHelper,&local_8c,local_68);
      if (iVar1 == 1) {
        Json::Value::Value((Value *)local_68,2);
        Json::Value::operator=(&local_40,(Value *)local_68);
        Json::Value::~Value((Value *)local_68);
        std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x7ec19f);
        local_8c = 1;
        local_68[0].string_ = (char *)&local_40;
        if ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_._16_8_ == 0) goto LAB_00179d51;
        iVar1 = (*(code *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_,&local_88,local_68
                          );
        if (iVar1 == 3) {
          local_68[0].string_ = (char *)&local_40;
          if ((anonymous_namespace)::RequiredIntHelper._16_8_ == 0) goto LAB_00179d51;
          iVar1 = (*(code *)(anonymous_namespace)::RequiredIntHelper._24_8_)
                            ((anonymous_namespace)::RequiredIntHelper,&local_8c,local_68);
          if (iVar1 == 0) {
            if (local_8c == 2) {
              std::__cxx11::string::operator=((string *)&local_88,"default");
              local_8c = 1;
              local_68[0].int_ = 0;
              if ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_._16_8_ == 0)
              goto LAB_00179d51;
              iVar1 = (*(code *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_._24_8_)
                                ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_,&local_88,
                                 local_68);
              if (iVar1 == 7) {
                local_68[0].int_ = 0;
                if ((anonymous_namespace)::RequiredIntHelper._16_8_ == 0) goto LAB_00179d51;
                iVar1 = (*(code *)(anonymous_namespace)::RequiredIntHelper._24_8_)
                                  ((anonymous_namespace)::RequiredIntHelper,&local_8c,local_68);
                bVar3 = true;
                if (iVar1 == 7) goto LAB_00179c2b;
                iVar1 = 0x1c6;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(RequiredIntHelper(i, nullptr) == ErrorCode::MissingRequired) failed on line "
                           ,0x58);
              }
              else {
                iVar1 = 0x1c5;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(RequiredStringHelper(str, nullptr) == ErrorCode::MissingRequired) failed on line "
                           ,0x5d);
              }
            }
            else {
              iVar1 = 0x1c0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
            }
          }
          else {
            iVar1 = 0x1bf;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::Success) failed on line "
                       ,0x4b);
          }
        }
        else {
          iVar1 = 0x1be;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::InvalidString) failed on line "
                     ,0x56);
        }
      }
      else {
        iVar1 = 0x1b9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::InvalidInt) failed on line ",
                   0x4e);
      }
    }
    else {
      iVar1 = 0x1b8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line ",0x2b);
    }
  }
  else {
    iVar1 = 0x1b7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::Success) failed on line ",
               0x50);
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  bVar3 = false;
LAB_00179c2b:
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  Json::Value::~Value(&local_40);
  return bVar3;
}

Assistant:

bool testRequired()
{
  Json::Value v = "Hello";

  std::string str = "default";
  int i = 1;
  ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::Success);
  ASSERT_TRUE(str == "Hello");
  ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::InvalidInt);

  v = 2;
  str = "default";
  i = 1;
  ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::InvalidString);
  ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::Success);
  ASSERT_TRUE(i == 2);

  str = "default";
  i = 1;
  ASSERT_TRUE(RequiredStringHelper(str, nullptr) ==
              ErrorCode::MissingRequired);
  ASSERT_TRUE(RequiredIntHelper(i, nullptr) == ErrorCode::MissingRequired);

  return true;
}